

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O0

void __thiscall
agge::tests::GenericRGBXBlenderTests::PixelComponentsAreSetAccordinglyToOrderOnCopy
          (GenericRGBXBlenderTests *this)

{
  allocator local_e1;
  string local_e0 [32];
  LocationInfo local_c0;
  allocator local_81;
  string local_80 [32];
  LocationInfo local_60;
  pixel_rgbx<agge::order_argb> local_38;
  pixel_rgbx<agge::order_bgra> local_34;
  pixel2 reference2;
  pixel1 reference1;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb> b2;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra> b1;
  pixel2 dest2;
  pixel1 dest1;
  GenericRGBXBlenderTests *this_local;
  
  b1._a = 0;
  b1._color.r = '\0';
  b1._color.g = '\0';
  b1._color.b = '\0';
  b1._color.a = '\0';
  b2._color = color::make('\x01','\x02','\x03',0xff);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>::
  blender_solid_color_rgb
            ((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>
              *)&b2._a,b2._color);
  reference2.components = (uint8_t  [4])color::make('\x11','\x12','\x13',0xff);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>::
  blender_solid_color_rgb
            ((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>
              *)&reference1,(color)reference2.components);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>::
  operator()((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>
              *)&b2._a,(pixel *)&b1._a,0,0,1);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>::
  operator()((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>
              *)&reference1,(pixel *)&b1,0,0,1);
  builtin_memcpy(local_34.components,"\x03\x02\x01",4);
  local_38.components[0] = '\0';
  local_38.components[1] = '\x11';
  local_38.components[2] = '\x12';
  local_38.components[3] = '\x13';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_81);
  ut::LocationInfo::LocationInfo(&local_60,(string *)local_80,0x13b);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,agge::tests::mocks::pixel_rgbx<agge::order_bgra>>
            (&local_34,(pixel_rgbx<agge::order_bgra> *)&b1._a,&local_60);
  ut::LocationInfo::~LocationInfo(&local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_e1);
  ut::LocationInfo::LocationInfo(&local_c0,(string *)local_e0,0x13c);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_argb>,agge::tests::mocks::pixel_rgbx<agge::order_argb>>
            (&local_38,(pixel_rgbx<agge::order_argb> *)&b1,&local_c0);
  ut::LocationInfo::~LocationInfo(&local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

test( PixelComponentsAreSetAccordinglyToOrderOnCopy )
			{
				typedef mocks::pixel_rgbx<order_bgra> pixel1;
				typedef mocks::pixel_rgbx<order_argb> pixel2;

				// INIT
				pixel1 dest1 = { };
				pixel2 dest2 = { };
				blender_solid_color_rgb<pixel1, order_bgra> b1(color::make(0x01, 0x02, 0x03));
				blender_solid_color_rgb<pixel2, order_argb> b2(color::make(0x11, 0x12, 0x13));

				// ACT
				b1(&dest1, 0, 0, 1);
				b2(&dest2, 0, 0, 1);

				// ASSERT
				pixel1 reference1 = { { 0x03, 0x02, 0x01, } };
				pixel2 reference2 = { { 0, 0x11, 0x12, 0x13, } };

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
			}